

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_cpsave(m68k_info *info)

{
  cs_m68k *pcVar1;
  cs_m68k_op *in_RDI;
  m68k_info *unaff_retaddr;
  cs_m68k *ext;
  undefined8 in_stack_fffffffffffffff0;
  
  if ((*(uint *)&(in_RDI->br_disp).disp_size & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x39f6b3);
  }
  else {
    pcVar1 = build_init_op(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                           (int)((ulong)in_stack_fffffffffffffff0 >> 0x20));
    get_ea_mode_op(unaff_retaddr,in_RDI,(uint)((ulong)pcVar1 >> 0x20),(uint)pcVar1);
  }
  return;
}

Assistant:

static void d68020_cpsave(m68k_info *info)
{
	cs_m68k* ext;

	LIMIT_CPU_TYPES(info, M68020_PLUS);

	ext = build_init_op(info, M68K_INS_FSAVE, 1, 0);
	get_ea_mode_op(info, &ext->operands[0], info->ir, 1);
}